

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)128>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedTypeCases)

{
  TestCaseGroup *pTVar1;
  LayoutQualifier *pLVar2;
  undefined7 in_register_00000009;
  SharedPtr matrixOrder;
  Layout local_34;
  
  if ((int)CONCAT71(in_register_00000009,extendedTypeCases) != 0) {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar1,context,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    generateBufferVariableMatrixVariableBasicTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  }
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"no_qualifier","No qualifier");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,parentStructure,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  pLVar2 = (LayoutQualifier *)operator_new(0x38);
  glu::Layout::Layout(&local_34,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_COLUMN_MAJOR);
  ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar2,parentStructure,&local_34);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&matrixOrder,(Node *)pLVar2);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"column_major","Column major qualifier");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,&matrixOrder,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&matrixOrder);
  pLVar2 = (LayoutQualifier *)operator_new(0x38);
  glu::Layout::Layout(&local_34,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_ROW_MAJOR);
  ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar2,parentStructure,&local_34);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&matrixOrder,(Node *)pLVar2);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"row_major","Row major qualifier");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,&matrixOrder,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&matrixOrder);
  return;
}

Assistant:

static void generateBufferVariableMatrixCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool extendedTypeCases)
{
	// .types
	if (extendedTypeCases)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "types", "Types");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableBasicTypeCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .no_qualifier
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "no_qualifier", "No qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .column_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_COLUMN_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "column_major", "Column major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}

	// .row_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_ROW_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "row_major", "Row major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}
}